

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall slang::ast::Scope::addDeferredMembers(Scope *this,SyntaxNode *syntax)

{
  DeferredMemberData *in_RDI;
  DeferredMemberSymbol *sym;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  
  BumpAllocator::
  emplace<(anonymous_namespace)::DeferredMemberSymbol,slang::syntax::SyntaxNode_const&>
            ((BumpAllocator *)in_RDI,
             (SyntaxNode *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  addMember((Scope *)in_RDI,(Symbol *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
  ;
  getOrAddDeferredData((Scope *)0x494bc3);
  DeferredMemberData::addMember
            (in_RDI,(Symbol *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  countMembers((SyntaxNode *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  ast::operator+=((SymbolIndex *)in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void Scope::addDeferredMembers(const SyntaxNode& syntax) {
    auto sym = compilation.emplace<DeferredMemberSymbol>(syntax);
    addMember(*sym);
    getOrAddDeferredData().addMember(sym);

    // We need to figure out how many new symbols could be inserted when we
    // later elaborate this deferred member, so that we can make room in the
    // index space such that no symbols need to overlap.
    sym->indexInScope += (uint32_t)countMembers(syntax);
}